

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall
loader::Logger::Logger
          (Logger *this,string *logger_name,string *filename,string *log_level,
          bool logging_enabled_env,string *format)

{
  ulong uVar1;
  element_type *this_00;
  string local_120 [32];
  string local_100 [40];
  spdlog_ex *exception;
  file_event_handlers local_c8;
  shared_ptr<spdlog::logger> local_48;
  string *local_38;
  string *format_local;
  string *psStack_28;
  bool logging_enabled_env_local;
  string *log_level_local;
  string *filename_local;
  string *logger_name_local;
  Logger *this_local;
  
  this->log_to_console = true;
  this->logging_enabled = false;
  local_38 = format;
  format_local._7_1_ = logging_enabled_env;
  psStack_28 = log_level;
  log_level_local = filename;
  filename_local = logger_name;
  logger_name_local = (string *)this;
  std::shared_ptr<spdlog::logger>::shared_ptr(&this->_logger,(nullptr_t)0x0);
  if ((format_local._7_1_ & 1) != 0) {
    this->logging_enabled = (bool)(format_local._7_1_ & 1);
    spdlog::file_event_handlers::file_event_handlers(&local_c8);
    spdlog::basic_logger_st<spdlog::synchronous_factory>
              ((spdlog *)&local_48,logger_name,filename,false,&local_c8);
    std::shared_ptr<spdlog::logger>::operator=(&this->_logger,&local_48);
    std::shared_ptr<spdlog::logger>::~shared_ptr(&local_48);
    spdlog::file_event_handlers::~file_event_handlers(&local_c8);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->_logger);
      std::__cxx11::string::string(local_100,(string *)format);
      spdlog::logger::set_pattern(this_00,(string *)local_100,local);
      std::__cxx11::string::~string(local_100);
    }
    std::__cxx11::string::string(local_120,(string *)log_level);
    setLogLevel(this,(string *)local_120);
    std::__cxx11::string::~string(local_120);
  }
  return;
}

Assistant:

Logger(std::string logger_name, std::string filename, std::string log_level, bool logging_enabled_env, std::string format = "") {
    if (logging_enabled_env) {
      logging_enabled = logging_enabled_env;
      try {
        _logger = spdlog::basic_logger_st(logger_name, filename);
      } catch (spdlog::spdlog_ex &exception) {
        std::cerr << "Unable to create log file: " << exception.what() << "\n";
        logging_enabled = false;
        return;
      }

      if (!format.empty()) {
        _logger->set_pattern(format);
      }

      setLogLevel(log_level);
    }
  }